

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters.c
# Opt level: O3

void ihevc_inter_pred_luma_vert
               (UWORD8 *pu1_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  short sVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  byte *pbVar5;
  long lVar6;
  byte *pbVar7;
  byte *pbVar8;
  ulong uVar9;
  
  if (0 < ht) {
    lVar3 = (long)src_strd;
    pbVar5 = pu1_src + lVar3 * -3;
    iVar4 = 0;
    do {
      if (0 < wd) {
        uVar9 = 0;
        pbVar8 = pbVar5;
        do {
          lVar6 = 0;
          sVar1 = 0;
          pbVar7 = pbVar8;
          do {
            sVar1 = sVar1 + (ushort)*pbVar7 * (short)pi1_coeff[lVar6];
            lVar6 = lVar6 + 1;
            pbVar7 = pbVar7 + lVar3;
          } while (lVar6 != 8);
          iVar2 = sVar1 * 0x400 + 0x8000 >> 0x10;
          if (iVar2 < 1) {
            iVar2 = 0;
          }
          if (0xfe < iVar2) {
            iVar2 = 0xff;
          }
          pu1_dst[uVar9] = (UWORD8)iVar2;
          uVar9 = uVar9 + 1;
          pbVar8 = pbVar8 + 1;
        } while (uVar9 != (uint)wd);
      }
      pu1_dst = pu1_dst + dst_strd;
      iVar4 = iVar4 + 1;
      pbVar5 = pbVar5 + lVar3;
    } while (iVar4 != ht);
  }
  return;
}

Assistant:

void ihevc_inter_pred_luma_vert(UWORD8 *pu1_src,
                                UWORD8 *pu1_dst,
                                WORD32 src_strd,
                                WORD32 dst_strd,
                                WORD8 *pi1_coeff,
                                WORD32 ht,
                                WORD32 wd)
{
    WORD32 row, col, i;
    WORD16 i2_tmp;

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < wd; col++)
        {
            i2_tmp = 0;
            for(i = 0; i < NTAPS_LUMA; i++)
                i2_tmp += pi1_coeff[i] * pu1_src[col + (i - 3) * src_strd];

            i2_tmp = (i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH;
            i2_tmp = CLIP_U8(i2_tmp);

            pu1_dst[col] = (UWORD8)i2_tmp;
        }

        pu1_src += src_strd;
        pu1_dst += dst_strd;
    }

}